

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O2

void swrenderer::R_HighlightPortal(PortalDrawseg *pds)

{
  BYTE *pBVar1;
  short *psVar2;
  short *psVar3;
  uint uVar4;
  uint uVar5;
  _func_int **pp_Var6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  
  uVar4 = BestColor((uint32 *)&GPalette,0xff,0,0,0,0xff);
  pBVar1 = RenderTarget->Buffer;
  uVar13 = (ulong)pds->x1;
  do {
    uVar12 = (uint)uVar13;
    if (pds->x2 <= (int)uVar12) {
      return;
    }
    if ((-1 < (int)uVar12) && ((int)uVar12 < RenderTarget->Width)) {
      uVar5 = pds->x1;
      psVar2 = (pds->ceilingclip).Array;
      psVar3 = (pds->floorclip).Array;
      uVar9 = (uint)psVar2[uVar13 - (long)(int)uVar5];
      uVar8 = (ulong)uVar9;
      uVar10 = (uint)psVar3[uVar13 - (long)(int)uVar5];
      if (uVar12 == pds->x2 - 1U || uVar12 == uVar5) {
        uVar10 = uVar10 + 1;
        pp_Var6 = (RenderTarget->super_DObject)._vptr_DObject;
      }
      else {
        uVar7 = (uint)psVar2[(int)(~uVar5 + uVar12)];
        uVar11 = (uint)psVar3[(int)(~uVar5 + uVar12)];
        uVar5 = uVar9 - uVar7;
        uVar12 = -uVar5;
        if (0 < (int)uVar5) {
          uVar12 = uVar5;
        }
        if (uVar12 < 2) {
          pBVar1[(uVar13 & 0xffffffff) + (long)(int)uVar9 * (long)RenderTarget->Pitch] = (BYTE)uVar4
          ;
        }
        else {
          (*(RenderTarget->super_DObject)._vptr_DObject[0x14])
                    (RenderTarget,uVar13 & 0xffffffff,(ulong)uVar7,uVar13 & 0xffffffff,uVar8,
                     (ulong)(uVar4 & 0xff),0);
        }
        uVar5 = uVar10 - uVar11;
        uVar12 = -uVar5;
        if (0 < (int)uVar5) {
          uVar12 = uVar5;
        }
        if (uVar12 < 2) {
          pBVar1[(uVar13 & 0xffffffff) + (long)(int)uVar10 * (long)RenderTarget->Pitch] =
               (BYTE)uVar4;
          goto LAB_0030782a;
        }
        pp_Var6 = (RenderTarget->super_DObject)._vptr_DObject;
        uVar8 = (ulong)uVar11;
      }
      (*pp_Var6[0x14])(RenderTarget,uVar13 & 0xffffffff,uVar8,uVar13 & 0xffffffff,(ulong)uVar10,
                       (ulong)(uVar4 & 0xff),0);
    }
LAB_0030782a:
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void R_HighlightPortal (PortalDrawseg* pds)
{
	// [ZZ] NO OVERFLOW CHECKS HERE
	//      I believe it won't break. if it does, blame me. :(

	BYTE color = (BYTE)BestColor((DWORD *)GPalette.BaseColors, 255, 0, 0, 0, 255);

	BYTE* pixels = RenderTarget->GetBuffer();
	// top edge
	for (int x = pds->x1; x < pds->x2; x++)
	{
		if (x < 0 || x >= RenderTarget->GetWidth())
			continue;

		int p = x - pds->x1;
		int Ytop = pds->ceilingclip[p];
		int Ybottom = pds->floorclip[p];

		if (x == pds->x1 || x == pds->x2-1)
		{
			RenderTarget->DrawLine(x, Ytop, x, Ybottom+1, color, 0);
			continue;
		}

		int YtopPrev = pds->ceilingclip[p-1];
		int YbottomPrev = pds->floorclip[p-1];

		if (abs(Ytop-YtopPrev) > 1)
			RenderTarget->DrawLine(x, YtopPrev, x, Ytop, color, 0);
		else *(pixels + Ytop * RenderTarget->GetPitch() + x) = color;

		if (abs(Ybottom-YbottomPrev) > 1)
			RenderTarget->DrawLine(x, YbottomPrev, x, Ybottom, color, 0);
		else *(pixels + Ybottom * RenderTarget->GetPitch() + x) = color;
	}
}